

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_drop_record(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol;
  jx9_int64 nId;
  int iFlag;
  char *pcVar2;
  uint iBool;
  int nByte;
  SyString sName;
  
  if (argc < 2) {
    pcVar2 = "Missing collection name and/or records";
LAB_00116fe9:
    jx9_context_throw_error(pCtx,1,pcVar2);
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,&nByte);
    if (nByte < 1) {
      pcVar2 = "Invalid collection name";
      goto LAB_00116fe9;
    }
    sName.nByte = nByte;
    sName.zString = pcVar2;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      nId = jx9_value_to_int64(argv[1]);
      iVar1 = unqliteCollectionDropRecord(pCol,nId,1,1);
      iBool = (uint)(iVar1 == 0);
      goto LAB_00116ff9;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&sName);
  }
  iBool = 0;
LAB_00116ff9:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_drop_record(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	jx9_int64 nId;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Extract the record ID */
	nId = jx9_value_to_int64(argv[1]);
	/* Drop the record */
	rc = unqliteCollectionDropRecord(pCol,nId,1,1);
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}